

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2projections.cc
# Opt level: O2

R2Point __thiscall S2::MercatorProjection::Project(MercatorProjection *this,S2Point *p)

{
  R2Point RVar1;
  S2LatLng local_20;
  
  S2LatLng::S2LatLng(&local_20,p);
  RVar1 = FromLatLng(this,&local_20);
  return (R2Point)RVar1.c_;
}

Assistant:

R2Point MercatorProjection::Project(const S2Point& p) const {
  return FromLatLng(S2LatLng(p));
}